

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O3

uchar * Gia_WriteEquivClassesInt(Gia_Man_t *p,int *pEquivSize)

{
  uint *puVar1;
  Gia_Rpr_t *pGVar2;
  int *piVar3;
  bool bVar4;
  byte bVar5;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  int iVar13;
  uchar *puVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  byte *pbVar23;
  ulong uVar24;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  pGVar2 = p->pReprs;
  if ((pGVar2 == (Gia_Rpr_t *)0x0) || (piVar3 = p->pNexts, piVar3 == (int *)0x0)) {
    __assert_fail("p->pReprs && p->pNexts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAigerExt.c"
                  ,0x4f,"unsigned char *Gia_WriteEquivClassesInt(Gia_Man_t *, int *)");
  }
  iVar20 = p->nObjs;
  uVar24 = (ulong)iVar20;
  if ((long)uVar24 < 2) {
    puVar14 = (uchar *)malloc(0x28);
    puVar14[4] = '\x01';
    uVar15 = 5;
  }
  else {
    iVar13 = 0;
    uVar16 = 1;
    do {
      iVar13 = iVar13 + (uint)(((uint)pGVar2[uVar16] & 0xfffffff) == 0);
      if ((((uint)pGVar2[uVar16] & 0xfffffff) == 0xfffffff) && (0 < piVar3[uVar16])) {
        uVar18 = uVar16 & 0xffffffff;
        do {
          iVar13 = iVar13 + 1;
          puVar1 = (uint *)(piVar3 + uVar18);
          uVar18 = (ulong)*puVar1;
        } while (0 < (int)*puVar1);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar24);
    puVar14 = (uchar *)malloc((long)iVar13 * 4 + 0x28);
    puVar14[4] = '\x01';
    uVar15 = 5;
    if (1 < iVar20) {
      iVar13 = 0;
      uVar15 = 5;
      uVar16 = 1;
      do {
        if (((uint)pGVar2[uVar16] & 0xfffffff) == 0) {
          iVar13 = (int)uVar16 - iVar13;
          if (iVar13 < 0) goto LAB_001d4c8d;
          uVar17 = ((uint)pGVar2[uVar16] >> 0x1b & 2) + iVar13 * 4;
          if (0x7f < (uint)(iVar13 * 4)) {
            pbVar23 = puVar14 + (int)uVar15;
            uVar22 = uVar17;
            do {
              *pbVar23 = (byte)uVar22 | 0x80;
              uVar17 = uVar22 >> 7;
              pbVar23 = pbVar23 + 1;
              uVar15 = uVar15 + 1;
              bVar4 = 0x3fff < uVar22;
              uVar22 = uVar17;
            } while (bVar4);
          }
          lVar19 = (long)(int)uVar15;
          uVar15 = uVar15 + 1;
          puVar14[lVar19] = (uchar)uVar17;
          iVar13 = (int)uVar16;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar24);
      if (1 < iVar20) {
        iVar20 = 0;
        uVar16 = 1;
        do {
          if (((~(uint)pGVar2[uVar16] & 0xfffffff) == 0) &&
             (uVar17 = piVar3[uVar16], 0 < (int)uVar17)) {
            uVar22 = (int)uVar16 - iVar20;
            if ((int)uVar22 < 0) {
LAB_001d4c8d:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            uVar18 = (ulong)(uVar22 * 2 + 1);
            lVar19 = (long)(int)uVar15;
            if (0x3f < uVar22) {
              pbVar23 = puVar14 + lVar19;
              lVar19 = lVar19 << 0x20;
              do {
                lVar19 = lVar19 + 0x100000000;
                uVar22 = (uint)uVar18;
                *pbVar23 = (byte)uVar18 | 0x80;
                uVar18 = uVar18 >> 7;
                pbVar23 = pbVar23 + 1;
                uVar15 = uVar15 + 1;
              } while (0x3fff < uVar22);
              lVar19 = lVar19 >> 0x20;
            }
            puVar14[lVar19] = (uchar)uVar18;
            uVar15 = uVar15 + 1;
            uVar18 = uVar16 & 0xffffffff;
            do {
              iVar20 = uVar17 - (int)uVar18;
              if (iVar20 < 0) goto LAB_001d4c8d;
              uVar18 = (ulong)uVar17;
              uVar21 = (ulong)(((uint)pGVar2[uVar17] >> 0x1b & 2) + iVar20 * 4);
              if (0x7f < (uint)(iVar20 * 4)) {
                pbVar23 = puVar14 + (int)uVar15;
                do {
                  uVar22 = (uint)uVar21;
                  *pbVar23 = (byte)uVar21 | 0x80;
                  uVar21 = uVar21 >> 7;
                  pbVar23 = pbVar23 + 1;
                  uVar15 = uVar15 + 1;
                } while (0x3fff < uVar22);
              }
              puVar14[(int)uVar15] = (uchar)uVar21;
              uVar15 = uVar15 + 1;
              uVar17 = piVar3[uVar17];
              iVar20 = (int)uVar16;
            } while (0 < (int)uVar17);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar24);
      }
    }
  }
  uVar10 = (ushort)(uVar15 >> 0x10) & 0xff;
  uVar11 = (ushort)(uVar15 >> 8) & 0xff;
  uVar12 = (ushort)uVar15 & 0xff;
  bVar5 = (byte)(uVar15 >> 0x18);
  uVar9 = (ushort)bVar5;
  bVar5 = (uVar9 != 0) * (uVar9 < 0x100) * bVar5 - (0xff < uVar9);
  bVar6 = ((uVar15 & 0xff0000) != 0) * (uVar10 < 0x100) * (char)(uVar15 >> 0x10) - (0xff < uVar10);
  bVar7 = ((uVar15 & 0xff00) != 0) * (uVar11 < 0x100) * (char)(uVar15 >> 8) - (0xff < uVar11);
  bVar8 = ((uVar15 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar15 - (0xff < uVar12);
  *(uint *)puVar14 =
       CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                CONCAT12((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                         CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                  (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5))));
  *pEquivSize = uVar15;
  return puVar14;
}

Assistant:

unsigned char * Gia_WriteEquivClassesInt( Gia_Man_t * p, int * pEquivSize )
{
    unsigned char * pBuffer;
    int iRepr, iNode, iPrevRepr, iPrevNode, iLit, nItems, iPos;
    assert( p->pReprs && p->pNexts );
    // count the number of entries to be written
    nItems = 0;
    for ( iRepr = 1; iRepr < Gia_ManObjNum(p); iRepr++ )
    {
        nItems += Gia_ObjIsConst( p, iRepr );
        if ( !Gia_ObjIsHead(p, iRepr) )
            continue;
        Gia_ClassForEachObj( p, iRepr, iNode )
            nItems++;
    }
    pBuffer = ABC_ALLOC( unsigned char, sizeof(int) * (nItems + 10) );
    // write constant class
    iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, 4, Abc_Var2Lit(0, 1) );
    iPrevNode = 0;
    for ( iNode = 1; iNode < Gia_ManObjNum(p); iNode++ )
        if ( Gia_ObjIsConst(p, iNode) )
        {
            iLit = Abc_Var2Lit( iNode - iPrevNode, Gia_ObjProved(p, iNode) );
            iPrevNode = iNode;
            iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Abc_Var2Lit(iLit, 0) );
        }
    // write non-constant classes
    iPrevRepr = 0;
    Gia_ManForEachClass( p, iRepr )
    {
        iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Abc_Var2Lit(iRepr - iPrevRepr, 1) );
        iPrevRepr = iPrevNode = iRepr;
        Gia_ClassForEachObj1( p, iRepr, iNode )
        {
            iLit = Abc_Var2Lit( iNode - iPrevNode, Gia_ObjProved(p, iNode) );
            iPrevNode = iNode;
            iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Abc_Var2Lit(iLit, 0) );
        }
    }
    Gia_AigerWriteInt( pBuffer, iPos );
    *pEquivSize = iPos;
    return pBuffer;
}